

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O1

void QUnicodeTools::Tailored::indicAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  char16_t cVar1;
  char16_t cVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  if (0 < len) {
    lVar7 = 0;
    do {
      cVar1 = text[from + lVar7];
      if ((ushort)(cVar1 + L'\xf200') < 0xfb00) {
        uVar8 = 1;
        if (cVar1 != L'◌') {
          uVar8 = ((cVar1 & 0xfffeU) != 0x200c) + 9;
        }
      }
      else {
        uVar8 = (uint)(byte)indicForms[(ushort)cVar1 - 0x900];
      }
      if ((uVar8 == 7) || (lVar9 = 1, uVar8 == 1)) {
        lVar9 = 1;
        do {
          if (len - lVar7 <= lVar9) break;
          cVar2 = text[from + lVar7 + lVar9];
          if ((ushort)(cVar2 + L'\xf200') < 0xfb00) {
            uVar6 = 1;
            if (cVar2 != L'◌') {
              uVar6 = ((cVar2 & 0xfffeU) != 0x200c) + 9;
            }
          }
          else {
            uVar6 = (uint)(byte)indicForms[(ushort)cVar2 - 0x900];
          }
          bVar3 = true;
          uVar5 = uVar6;
          switch(uVar6) {
          case 0:
          case 7:
          case 10:
            break;
          case 1:
            if ((uVar8 == 3) &&
               ((uVar5 = 1, script != Script_Sinhala ||
                (text[from + lVar7 + lVar9 + -1] == L'\x200d')))) goto switchD_0034593f_default;
            break;
          case 2:
            uVar5 = 2;
            if (uVar8 == 1) goto switchD_0034593f_default;
            break;
          case 3:
            uVar5 = 3;
            if ((uVar8 - 1 < 2) ||
               ((lVar9 == 1 && script == Script_Bengali && ((cVar1 == L'অ' || (cVar1 == L'এ'))))
               )) goto switchD_0034593f_default;
            if (((script == Script_Sinhala) && (uVar8 == 4)) ||
               (((script == Script_Malayalam && (uVar8 == 4)) &&
                (text[from + lVar7 + lVar9 + -1] == L'ു')))) {
              lVar9 = lVar9 + 1;
              uVar8 = 4;
              bVar3 = false;
            }
            break;
          case 4:
            if (uVar8 < 5) {
              uVar4 = 0x16;
LAB_00345a18:
              if ((uVar4 >> (uVar8 & 0x1f) & 1) != 0) goto switchD_0034593f_default;
            }
LAB_00345ad8:
            if (((script == Script_Bengali) && (cVar2 == L'া')) &&
               (uVar5 = uVar6, text[from + lVar7 + lVar9 + -1] == L'অ'))
            goto switchD_0034593f_default;
            break;
          case 5:
            if (8 < uVar8) goto LAB_00345ad8;
            if ((400U >> (uVar8 & 0x1f) & 1) == 0) {
              uVar4 = 6;
              goto LAB_00345a18;
            }
          default:
switchD_0034593f_default:
            uVar8 = uVar5;
            lVar9 = lVar9 + 1;
            bVar3 = false;
            break;
          case 6:
            if ((8 < uVar8) ||
               ((((400U >> (uVar8 & 0x1f) & 1) == 0 && ((6U >> (uVar8 & 0x1f) & 1) == 0)) &&
                (uVar5 = 6, uVar8 != 5)))) goto LAB_00345ad8;
            goto switchD_0034593f_default;
          case 8:
            uVar5 = 8;
            if (uVar8 == 4) goto switchD_0034593f_default;
            break;
          case 9:
            if ((((uVar8 == 3) && (uVar5 = 3, cVar2 == L'\x200d')) ||
                ((script == Script_Bengali &&
                 (((uVar8 == 1 && (cVar2 == L'\x200d')) &&
                  (uVar5 = 1, text[from + lVar7 + lVar9 + -1] == L'র')))))) ||
               (((script == Script_Kannada && (uVar8 == 1)) &&
                ((cVar2 == L'\x200d' && (uVar5 = 1, text[from + lVar7 + lVar9 + -1] == L'ರ'))))))
            goto switchD_0034593f_default;
            lVar9 = lVar9 + 1;
          }
        } while (!bVar3);
      }
      attributes[lVar7 + from] = (QCharAttributes)((byte)attributes[lVar7 + from] | 1);
      lVar10 = lVar9 + lVar7;
      if (len <= lVar9 + lVar7) {
        lVar10 = len;
      }
      lVar7 = lVar7 + 1;
      if (lVar7 < lVar10) {
        do {
          attributes[lVar7 + from] = (QCharAttributes)((byte)attributes[lVar7 + from] & 0xfe);
          lVar7 = lVar7 + 1;
        } while (lVar10 != lVar7);
      }
    } while (lVar7 < len);
  }
  return;
}

Assistant:

static void indicAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    attributes += from;
    qsizetype i = 0;
    while (i < len) {
        bool invalid;
        qsizetype boundary = indic_nextSyllableBoundary(script, text, from+i, end, &invalid) - from;
         attributes[i].graphemeBoundary = true;

        if (boundary > len-1) boundary = len;
        i++;
        while (i < boundary) {
            attributes[i].graphemeBoundary = false;
            ++i;
        }
        assert(i == boundary);
    }


}